

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qframe.cpp
# Opt level: O0

void __thiscall QFrame::changeEvent(QFrame *this,QEvent *ev)

{
  Type TVar1;
  QFramePrivate *this_00;
  QWidget *in_RSI;
  QFramePrivate *d;
  
  this_00 = d_func((QFrame *)0x49e561);
  TVar1 = QEvent::type((QEvent *)in_RSI);
  if (TVar1 == StyleChange) {
    QFramePrivate::updateFrameWidth(this_00);
  }
  QWidget::changeEvent(in_RSI,(QEvent *)this_00);
  return;
}

Assistant:

void QFrame::changeEvent(QEvent *ev)
{
    Q_D(QFrame);
    if (ev->type() == QEvent::StyleChange
#ifdef Q_OS_MAC
            || ev->type() == QEvent::MacSizeChange
#endif
            )
        d->updateFrameWidth();
    QWidget::changeEvent(ev);
}